

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpWriter.cpp
# Opt level: O2

void __thiscall OpenMD::DumpWriter::writeFrameProperties(DumpWriter *this,ostream *os,Snapshot *s)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  uint i;
  uint j;
  long lVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  double (*m) [3];
  uint j_1;
  double (*this_00) [3];
  RealType RVar6;
  pair<double,_double> pVar7;
  Mat3x3d eta;
  Mat3x3d hmat;
  shared_ptr<OpenMD::SPFData> spfData;
  char buffer [1024];
  
  std::operator<<(os,"    <FrameData>\n");
  RVar6 = Snapshot::getTime(s);
  if (0x7fefffffffffffff < (ulong)ABS(RVar6)) {
    builtin_strncpy(painCave.errMsg,"DumpWriter detected a numerical error writing the time",0x37);
    painCave.isFatal = 1;
    simError();
  }
  snprintf(buffer,0x400,"        Time: %.10g\n",RVar6);
  std::operator<<(os,buffer);
  this_00 = (double (*) [3])&hmat;
  SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)this_00);
  m = (double (*) [3])&eta;
  Snapshot::getHmat((Mat3x3d *)m,s);
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)this_00,(RectMatrix<double,_3U,_3U> *)m);
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      if (0x7fefffffffffffff < (ulong)ABS((*(double (*) [3])*this_00)[lVar5])) {
        builtin_strncpy(painCave.errMsg,"DumpWriter detected a numerical error writing the box",0x36
                       );
        painCave.isFatal = 1;
        simError();
      }
    }
    this_00 = this_00 + 1;
  }
  snprintf(buffer,0x400,
           "        Hmat: {{ %.10g, %.10g, %.10g }, { %.10g, %.10g, %.10g }, { %.10g, %.10g, %.10g }}\n"
           ,hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0],
           hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0],
           hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0],
           hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1],
           hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1],
           hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1],
           hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2],
           hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2]);
  std::operator<<(os,buffer);
  pVar7 = Snapshot::getThermostat(s);
  if (((0x7fefffffffffffff < (ulong)ABS(pVar7.first)) || (ABS(pVar7.second) == INFINITY)) ||
     (NAN(pVar7.second))) {
    builtin_strncpy(painCave.errMsg + 0x33,"hermostat",10);
    builtin_strncpy(painCave.errMsg + 0x20,"error writing the t",0x13);
    builtin_strncpy(painCave.errMsg + 0x10,"ted a numerical ",0x10);
    builtin_strncpy(painCave.errMsg,"DumpWriter detec",0x10);
    painCave.isFatal = 1;
    simError();
  }
  snprintf(buffer,0x400,"  Thermostat: %.10g , %.10g\n",pVar7.first);
  std::operator<<(os,buffer);
  SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)m);
  Snapshot::getBarostat((Mat3x3d *)&spfData,s);
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)m,(RectMatrix<double,_3U,_3U> *)&spfData);
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      if (0x7fefffffffffffff < (ulong)ABS((*(double (*) [3])*m)[lVar5])) {
        builtin_strncpy(painCave.errMsg + 0x33,"arostat",8);
        builtin_strncpy(painCave.errMsg + 0x20,"error writing the b",0x13);
        builtin_strncpy(painCave.errMsg + 0x10,"ted a numerical ",0x10);
        builtin_strncpy(painCave.errMsg,"DumpWriter detec",0x10);
        painCave.isFatal = 1;
        simError();
      }
    }
    m = m + 1;
  }
  snprintf(buffer,0x400,
           "    Barostat: {{ %.10g, %.10g, %.10g }, { %.10g, %.10g, %.10g }, { %.10g, %.10g, %.10g }}\n"
           ,eta.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0],
           eta.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0],
           eta.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0],
           eta.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1],
           eta.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1],
           eta.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1],
           eta.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2],
           eta.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2]);
  std::operator<<(os,buffer);
  Snapshot::getSPFData((Snapshot *)&spfData);
  dVar1 = ((spfData.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pos).
          super_Vector<double,_3U>.data_[0];
  if (((0x7fefffffffffffff < (ulong)ABS(dVar1)) ||
      (dVar2 = ((spfData.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               pos).super_Vector<double,_3U>.data_[1], 0x7fefffffffffffff < (ulong)ABS(dVar2))) ||
     ((dVar3 = ((spfData.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               pos).super_Vector<double,_3U>.data_[2], 0x7fefffffffffffff < (ulong)ABS(dVar3) ||
      (RVar6 = (spfData.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               lambda, 0x7fefffffffffffff < (ulong)ABS(RVar6))))) {
    memcpy(&painCave,"DumpWriter detected a numerical error writing the spf data structure",0x45);
    painCave.isFatal = 1;
    simError();
    dVar1 = ((spfData.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pos).
            super_Vector<double,_3U>.data_[0];
    dVar2 = ((spfData.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pos).
            super_Vector<double,_3U>.data_[1];
    dVar3 = ((spfData.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pos).
            super_Vector<double,_3U>.data_[2];
    RVar6 = (spfData.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->lambda
    ;
  }
  snprintf(buffer,0x400,"     SPFData: {{ %.10g, %.10g, %.10g }, %.10g, %d }\n",dVar1,dVar2,dVar3,
           RVar6,(ulong)(uint)(spfData.
                               super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->globalID,in_R8,in_R9,
           eta.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2]);
  std::operator<<(os,buffer);
  std::operator<<(os,"    </FrameData>\n");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&spfData.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void DumpWriter::writeFrameProperties(std::ostream& os, Snapshot* s) {
    char buffer[1024];

    os << "    <FrameData>\n";

    RealType currentTime = s->getTime();

    if (std::isinf(currentTime) || std::isnan(currentTime)) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpWriter detected a numerical error writing the time");
      painCave.isFatal = 1;
      simError();
    }

    snprintf(buffer, 1024, "        Time: %.10g\n", currentTime);
    os << buffer;

    Mat3x3d hmat;
    hmat = s->getHmat();

    for (unsigned int i = 0; i < 3; i++) {
      for (unsigned int j = 0; j < 3; j++) {
        if (std::isinf(hmat(i, j)) || std::isnan(hmat(i, j))) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "DumpWriter detected a numerical error writing the box");
          painCave.isFatal = 1;
          simError();
        }
      }
    }

    snprintf(
        buffer, 1024,
        "        Hmat: {{ %.10g, %.10g, %.10g }, { %.10g, %.10g, %.10g }, { "
        "%.10g, "
        "%.10g, %.10g }}\n",
        hmat(0, 0), hmat(1, 0), hmat(2, 0), hmat(0, 1), hmat(1, 1), hmat(2, 1),
        hmat(0, 2), hmat(1, 2), hmat(2, 2));
    os << buffer;

    pair<RealType, RealType> thermostat = s->getThermostat();

    if (std::isinf(thermostat.first) || std::isnan(thermostat.first) ||
        std::isinf(thermostat.second) || std::isnan(thermostat.second)) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpWriter detected a numerical error writing the thermostat");
      painCave.isFatal = 1;
      simError();
    }
    snprintf(buffer, 1024, "  Thermostat: %.10g , %.10g\n", thermostat.first,
             thermostat.second);
    os << buffer;

    Mat3x3d eta;
    eta = s->getBarostat();

    for (unsigned int i = 0; i < 3; i++) {
      for (unsigned int j = 0; j < 3; j++) {
        if (std::isinf(eta(i, j)) || std::isnan(eta(i, j))) {
          snprintf(
              painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
              "DumpWriter detected a numerical error writing the barostat");
          painCave.isFatal = 1;
          simError();
        }
      }
    }

    snprintf(
        buffer, 1024,
        "    Barostat: {{ %.10g, %.10g, %.10g }, { %.10g, %.10g, %.10g }, { "
        "%.10g, "
        "%.10g, %.10g }}\n",
        eta(0, 0), eta(1, 0), eta(2, 0), eta(0, 1), eta(1, 1), eta(2, 1),
        eta(0, 2), eta(1, 2), eta(2, 2));
    os << buffer;

    // SPF Data
    std::shared_ptr<SPFData> spfData = s->getSPFData();

    if (std::isinf(spfData->pos[0]) || std::isnan(spfData->pos[0]) ||
        std::isinf(spfData->pos[1]) || std::isnan(spfData->pos[1]) ||
        std::isinf(spfData->pos[2]) || std::isnan(spfData->pos[2]) ||
        std::isinf(spfData->lambda) || std::isnan(spfData->lambda)) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpWriter detected a numerical error writing the spf data "
               "structure");
      painCave.isFatal = 1;
      simError();
    }
    snprintf(buffer, 1024,
             "     SPFData: {{ %.10g, %.10g, %.10g }, %.10g, %d }\n",
             spfData->pos[0], spfData->pos[1], spfData->pos[2], spfData->lambda,
             spfData->globalID);
    os << buffer;

    os << "    </FrameData>\n";
  }